

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool createRcc(Options *options)

{
  QAnyStringView s;
  QLatin1StringView str;
  QAnyStringView s_00;
  QLatin1StringView str_00;
  QAnyStringView s_01;
  QLatin1StringView str_01;
  QAnyStringView s_02;
  QLatin1StringView str_02;
  QAnyStringView s_03;
  QLatin1StringView str_03;
  QAnyStringView s_04;
  QAnyStringView s_05;
  QLatin1StringView str_04;
  QAnyStringView s_06;
  QLatin1StringView str_05;
  QAnyStringView s_07;
  QLatin1StringView str_06;
  QAnyStringView s_08;
  QLatin1StringView str_07;
  QAnyStringView s_09;
  QAnyStringView s_10;
  QLatin1StringView str_08;
  QAnyStringView s_11;
  QAnyStringView s_12;
  QLatin1StringView str_09;
  QAnyStringView s_13;
  QLatin1StringView str_10;
  QAnyStringView s_14;
  QLatin1StringView latin1;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  char *pcVar5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar6;
  bool res;
  QLatin1StringView noZstd;
  QString currentDir;
  QString rcc;
  QString assetsDir;
  ArgBase *argBases_5 [3];
  ArgBase *argBases_1 [2];
  ArgBase *argBases_2 [2];
  ArgBase *argBases_3 [2];
  ArgBase *argBases_4 [2];
  ArgBase *argBases_6 [2];
  ArgBase *argBases_7 [2];
  ArgBase *argBases_8 [2];
  ArgBase *argBases_10 [2];
  ArgBase *argBases_11 [2];
  ArgBase *argBases [2];
  ArgBase *argBases_9 [5];
  QStringBuilder<const_QString_&,_QLatin1String> *in_stack_fffffffffffff398;
  undefined7 in_stack_fffffffffffff3a0;
  undefined1 in_stack_fffffffffffff3a7;
  QAnyStringView *in_stack_fffffffffffff3a8;
  FILE *pFVar7;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffff3b0;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this;
  QString *in_stack_fffffffffffff3b8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  undefined7 in_stack_fffffffffffff3c0;
  undefined1 in_stack_fffffffffffff3c7;
  Options *in_stack_fffffffffffff3c8;
  undefined7 in_stack_fffffffffffff3d0;
  char *in_stack_fffffffffffff3d8;
  bool local_be9;
  qsizetype local_9c8;
  char *local_9c0;
  undefined1 local_9b8 [24];
  QDir local_9a0 [8];
  QLatin1StringView local_998;
  undefined1 local_988 [48];
  QLatin1StringView local_958;
  undefined1 local_948 [96];
  QLatin1StringView local_8e8;
  undefined1 local_8d8 [24];
  QLatin1StringView local_8c0;
  undefined1 local_8b0 [24];
  QLatin1StringView local_898;
  undefined1 local_888 [24];
  QLatin1StringView local_870;
  QLatin1String local_860;
  QLatin1StringView local_850;
  undefined1 local_840 [48];
  QLatin1StringView local_810;
  undefined1 local_800 [24];
  QLatin1StringView local_7e8;
  QString local_7d8 [2];
  QLatin1StringView local_7a8;
  undefined1 local_798 [24];
  QString local_780 [2];
  QLatin1StringView local_750;
  QString local_6f8;
  QLatin1StringView local_6e0;
  undefined1 local_6d0 [24];
  QDir local_6b8 [8];
  QLatin1StringView local_6b0;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined1 local_678 [24];
  qsizetype local_660;
  char *local_658;
  ulong local_650;
  ArgBase **local_648;
  undefined1 local_630 [24];
  qsizetype local_618;
  char *local_610;
  ulong local_608;
  ArgBase **local_600;
  undefined1 local_5e8 [24];
  qsizetype local_5d0;
  char *local_5c8;
  ulong local_5c0;
  ArgBase **local_5b8;
  undefined1 local_5a0 [24];
  qsizetype local_588;
  char *local_580;
  ulong local_578;
  ArgBase **local_570;
  undefined1 local_558 [24];
  qsizetype local_540;
  char *local_538;
  ulong local_530;
  ArgBase **local_528;
  undefined1 local_510 [24];
  qsizetype local_4f8;
  char *local_4f0;
  ulong local_4e8;
  ArgBase **local_4e0;
  undefined1 local_4c8 [24];
  qsizetype local_4b0;
  char *local_4a8;
  ulong local_4a0;
  ArgBase **local_498;
  undefined1 local_480 [24];
  qsizetype local_468;
  char *local_460;
  ulong local_458;
  ArgBase **local_450;
  undefined1 local_438 [24];
  qsizetype local_420;
  char *local_418;
  ulong local_410;
  ArgBase **local_408;
  undefined1 local_3f0 [24];
  qsizetype local_3d8;
  char *local_3d0;
  ulong local_3c8;
  ArgBase **local_3c0;
  undefined1 local_3a8 [40];
  undefined1 local_380 [24];
  qsizetype local_368;
  char *local_360;
  ulong local_358;
  ArgBase **local_350;
  undefined1 local_338 [24];
  qsizetype local_320;
  char *local_318;
  undefined1 local_300 [40];
  undefined1 local_2d8 [40];
  undefined1 local_2b0 [24];
  qsizetype local_298;
  char *local_290;
  ulong local_288;
  ArgBase **local_280;
  ulong local_278;
  ArgBase **local_270;
  ulong local_268;
  ArgBase **local_260;
  ulong local_258;
  ArgBase **local_250;
  ulong local_248;
  ArgBase **local_240;
  ulong local_238;
  ArgBase **local_230;
  ulong local_228;
  ArgBase **local_220;
  ulong local_218;
  ArgBase **local_210;
  ulong local_208;
  ArgBase **local_200;
  ulong local_1f8;
  ArgBase **local_1f0;
  ulong local_1e8;
  ArgBase **local_1e0;
  ulong local_1d8;
  ArgBase **local_1d0;
  ulong local_1c8;
  ArgBase **local_1c0;
  ulong local_1b8;
  ArgBase **local_1b0;
  ulong local_1a8;
  ArgBase **local_1a0;
  ulong local_198;
  ArgBase **local_190;
  ulong local_188;
  ArgBase **local_180;
  ulong local_178;
  ArgBase **local_170;
  ulong local_168;
  ArgBase **local_160;
  ulong local_158;
  ArgBase **local_150;
  ulong local_148;
  ArgBase **local_140;
  ulong local_138;
  ArgBase **local_130;
  ulong local_128;
  ArgBase **local_120;
  ulong local_118;
  ArgBase **local_110;
  ulong local_108;
  ArgBase **local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_6a0 = 0xaaaaaaaaaaaaaaaa;
  local_698 = 0xaaaaaaaaaaaaaaaa;
  local_690 = 0xaaaaaaaaaaaaaaaa;
  local_6b0 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff3a8,
                         CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
  local_660 = local_6b0.m_size;
  local_658 = local_6b0.m_data;
  QVar6.m_data = (char *)in_stack_fffffffffffff3b8;
  QVar6.m_size = (qsizetype)in_stack_fffffffffffff3b0.m_data;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,QVar6);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff3b0.m_data,(QString *)in_stack_fffffffffffff3a8
            );
  s.m_size = (size_t)in_stack_fffffffffffff3b8;
  s.field_0.m_data = in_stack_fffffffffffff3b0.m_data;
  QtPrivate::qStringLikeToArg(s);
  local_128 = local_650;
  local_120 = local_648;
  local_48 = local_678;
  local_40 = 0;
  local_138 = local_650;
  local_130 = local_648;
  QtPrivate::argToQString((QAnyStringView *)&local_6a0,local_650,local_648);
  local_6e0 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff3a8,
                         CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
  local_3d8 = local_6e0.m_size;
  local_3d0 = local_6e0.m_data;
  str.m_data = (char *)in_stack_fffffffffffff3b8;
  str.m_size = (qsizetype)in_stack_fffffffffffff3b0.m_data;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffff3b0.m_data,(QString *)in_stack_fffffffffffff3a8
            );
  s_00.m_size = (size_t)in_stack_fffffffffffff3b8;
  s_00.field_0.m_data = in_stack_fffffffffffff3b0.m_data;
  QtPrivate::qStringLikeToArg(s_00);
  local_248 = local_3c8;
  local_240 = local_3c0;
  local_d8 = local_3f0;
  local_d0 = 0;
  local_258 = local_3c8;
  local_250 = local_3c0;
  QtPrivate::argToQString((QAnyStringView *)local_6d0,local_3c8,local_3c0);
  QDir::QDir(local_6b8,(QString *)local_6d0);
  bVar1 = QDir::exists();
  QDir::~QDir(local_6b8);
  QString::~QString((QString *)0x1247c9);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    if ((*(byte *)((long)in_RDI.m_data + 1) & 1) != 0) {
      fprintf(_stdout,"Create rcc bundle.\n");
    }
    local_6f8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_6f8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_6f8.d.size = -0x5555555555555556;
    QString::QString((QString *)0x12485a);
    bVar2 = QString::isEmpty((QString *)0x12486b);
    if (bVar2) {
      local_750 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffff3a8,
                             CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
      operator+((QString *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0),
                (QLatin1String *)in_stack_fffffffffffff398);
      QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff398);
      execSuffixAppended((QString *)in_stack_fffffffffffff398);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0),
                         (QString *)in_stack_fffffffffffff398);
      QString::~QString((QString *)0x124924);
      QString::~QString((QString *)0x124931);
    }
    else {
      QString::operator=(&local_6f8,(QString *)((long)in_RDI.m_data + 0x218));
    }
    uVar4 = QFile::exists((QString *)&local_6f8);
    if ((uVar4 & 1) == 0) {
      pFVar7 = _stderr;
      QtPrivate::asString(&local_6f8);
      QString::toLocal8Bit(in_stack_fffffffffffff3b8);
      pcVar5 = QByteArray::constData((QByteArray *)0x12497b);
      fprintf(pFVar7,"rcc not found: %s\n",pcVar5);
      QByteArray::~QByteArray((QByteArray *)0x12499e);
      local_be9 = false;
    }
    else {
      local_780[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_780[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_780[0].d.size = -0x5555555555555556;
      QDir::currentPath();
      local_7a8 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffff3a8,
                             CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
      local_420 = local_7a8.m_size;
      local_418 = local_7a8.m_data;
      str_00.m_data = (char *)in_stack_fffffffffffff3b8;
      str_00.m_size = (qsizetype)in_stack_fffffffffffff3b0.m_data;
      QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_00);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff3b0.m_data,
                 (QString *)in_stack_fffffffffffff3a8);
      s_01.m_size = (size_t)in_stack_fffffffffffff3b8;
      s_01.field_0.m_data = in_stack_fffffffffffff3b0.m_data;
      QtPrivate::qStringLikeToArg(s_01);
      local_228 = local_410;
      local_220 = local_408;
      local_c8 = local_438;
      local_c0 = 0;
      local_238 = local_410;
      local_230 = local_408;
      QtPrivate::argToQString((QAnyStringView *)local_798,local_410,local_408);
      bVar1 = QDir::setCurrent((QString *)local_798);
      bVar1 = bVar1 ^ 0xff;
      QString::~QString((QString *)0x124b8d);
      if ((bVar1 & 1) == 0) {
        this_00 = in_RDI;
        local_810 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffff3a8,
                               CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
        local_850 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffff3a8,
                               CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
        local_4b0 = local_850.m_size;
        local_4a8 = local_850.m_data;
        str_02.m_data = this_00.m_data_utf8;
        str_02.m_size = (qsizetype)in_stack_fffffffffffff3b0.m_data;
        QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_02);
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)in_stack_fffffffffffff3b0.m_data,
                   (QString *)in_stack_fffffffffffff3a8);
        s_03.m_size = (size_t)this_00.m_data;
        s_03.field_0.m_data = in_stack_fffffffffffff3b0.m_data;
        QtPrivate::qStringLikeToArg(s_03);
        local_1e8 = local_4a0;
        local_1e0 = local_498;
        local_a8 = local_4c8;
        local_a0 = 0;
        local_1f8 = local_4a0;
        local_1f0 = local_498;
        QtPrivate::argToQString((QAnyStringView *)local_840,local_4a0,local_498);
        shellQuote((QString *)in_stack_fffffffffffff3a8);
        local_368 = local_810.m_size;
        local_360 = local_810.m_data;
        str_03.m_data = this_00.m_data_utf8;
        str_03.m_size = (qsizetype)in_stack_fffffffffffff3b0.m_data;
        QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_03);
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)in_stack_fffffffffffff3b0.m_data,
                   (QString *)in_stack_fffffffffffff3a8);
        s_04.m_size = (size_t)this_00.m_data;
        s_04.field_0.m_data = in_stack_fffffffffffff3b0.m_data;
        QtPrivate::qStringLikeToArg(s_04);
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)in_stack_fffffffffffff3b0.m_data,
                   (QString *)in_stack_fffffffffffff3a8);
        s_05.m_size = (size_t)this_00.m_data;
        s_05.field_0.m_data = in_stack_fffffffffffff3b0.m_data;
        QtPrivate::qStringLikeToArg(s_05);
        local_268 = local_358;
        local_260 = local_350;
        local_f8 = local_380;
        local_f0 = local_3a8;
        local_e8 = 0;
        local_278 = local_358;
        local_270 = local_350;
        QtPrivate::argToQString((QAnyStringView *)local_800,local_358,local_350);
        bVar3 = runCommand(in_stack_fffffffffffff3c8,
                           (QString *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0))
        ;
        QString::~QString((QString *)0x125151);
        QString::~QString((QString *)0x12515e);
        QString::~QString((QString *)0x12516b);
        if ((bVar3 & 1) == 0) {
          local_be9 = false;
        }
        else {
          local_860.m_size = -0x5555555555555556;
          local_860.m_data = (char *)0xaaaaaaaaaaaaaaaa;
          QLatin1String::QLatin1String(&local_860);
          if ((*(byte *)((long)in_RDI.m_data + 0x389) & 1) == 0) {
            local_870 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_fffffffffffff3a8,
                                   CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
            local_860.m_size = local_870.m_size;
            local_860.m_data = local_870.m_data;
          }
          local_898 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffff3a8,
                                 CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
          local_4f8 = local_898.m_size;
          local_4f0 = local_898.m_data;
          str_04.m_data = this_00.m_data_utf8;
          str_04.m_size = (qsizetype)in_stack_fffffffffffff3b0.m_data;
          QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_04);
          QAnyStringView::QAnyStringView
                    ((QAnyStringView *)in_stack_fffffffffffff3b0.m_data,
                     (QString *)in_stack_fffffffffffff3a8);
          s_06.m_size = (size_t)this_00.m_data;
          s_06.field_0.m_data = in_stack_fffffffffffff3b0.m_data;
          QtPrivate::qStringLikeToArg(s_06);
          local_1c8 = local_4e8;
          local_1c0 = local_4e0;
          local_98 = local_510;
          local_90 = 0;
          local_1d8 = local_4e8;
          local_1d0 = local_4e0;
          QtPrivate::argToQString((QAnyStringView *)local_888,local_4e8,local_4e0);
          local_8c0 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffff3a8,
                                 CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
          local_540 = local_8c0.m_size;
          local_538 = local_8c0.m_data;
          str_05.m_data = this_00.m_data_utf8;
          str_05.m_size = (qsizetype)in_stack_fffffffffffff3b0.m_data;
          QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_05);
          QAnyStringView::QAnyStringView
                    ((QAnyStringView *)in_stack_fffffffffffff3b0.m_data,
                     (QString *)in_stack_fffffffffffff3a8);
          s_07.m_size = (size_t)this_00.m_data;
          s_07.field_0.m_data = in_stack_fffffffffffff3b0.m_data;
          QtPrivate::qStringLikeToArg(s_07);
          local_1a8 = local_530;
          local_1a0 = local_528;
          local_88 = local_558;
          local_80 = 0;
          local_1b8 = local_530;
          local_1b0 = local_528;
          QtPrivate::argToQString((QAnyStringView *)local_8b0,local_530,local_528);
          QFile::rename((QString *)local_888,(QString *)local_8b0);
          QString::~QString((QString *)0x125530);
          QString::~QString((QString *)0x12553d);
          this = in_RDI;
          local_8e8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffff3a8,
                                 CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffff3a8,
                     CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
          latin1.m_size._7_1_ = bVar1;
          latin1.m_size._0_7_ = in_stack_fffffffffffff3d0;
          latin1.m_data = in_stack_fffffffffffff3d8;
          QString::QString((QString *)this.m_data,latin1);
          shellQuote((QString *)in_stack_fffffffffffff3a8);
          local_958 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffff3a8,
                                 CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
          local_588 = local_958.m_size;
          local_580 = local_958.m_data;
          str_06.m_data = this_00.m_data_utf8;
          str_06.m_size = (qsizetype)this.m_data;
          QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_06);
          QAnyStringView::QAnyStringView
                    ((QAnyStringView *)this.m_data,(QString *)in_stack_fffffffffffff3a8);
          s_08.m_size = (size_t)this_00.m_data;
          s_08.field_0.m_data = this.m_data;
          QtPrivate::qStringLikeToArg(s_08);
          local_188 = local_578;
          local_180 = local_570;
          local_78 = local_5a0;
          local_70 = 0;
          local_198 = local_578;
          local_190 = local_570;
          QtPrivate::argToQString((QAnyStringView *)local_948,local_578,local_570);
          shellQuote((QString *)in_stack_fffffffffffff3a8);
          local_298 = local_8e8.m_size;
          local_290 = local_8e8.m_data;
          str_07.m_data = this_00.m_data_utf8;
          str_07.m_size = (qsizetype)this.m_data;
          QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_07);
          QAnyStringView::QAnyStringView
                    ((QAnyStringView *)this.m_data,(QString *)in_stack_fffffffffffff3a8);
          s_09.m_size = (size_t)this_00.m_data;
          s_09.field_0.m_data = this.m_data;
          QtPrivate::qStringLikeToArg(s_09);
          QAnyStringView::QAnyStringView
                    ((QAnyStringView *)this.m_data,(QString *)in_stack_fffffffffffff3a8);
          s_10.m_size = (size_t)this_00.m_data;
          s_10.field_0.m_data = this.m_data;
          QtPrivate::qStringLikeToArg(s_10);
          local_320 = local_860.m_size;
          local_318 = local_860.m_data;
          str_08.m_data = this_00.m_data_utf8;
          str_08.m_size = (qsizetype)this.m_data;
          QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_08);
          s_11.m_size = (size_t)this_00.m_data;
          s_11.field_0.m_data = this.m_data;
          QtPrivate::qStringLikeToArg(s_11);
          QAnyStringView::QAnyStringView
                    ((QAnyStringView *)this.m_data,(QString *)in_stack_fffffffffffff3a8);
          s_12.m_size = (size_t)this_00.m_data;
          s_12.field_0.m_data = this.m_data;
          QtPrivate::qStringLikeToArg(s_12);
          local_108 = local_288;
          local_100 = local_280;
          memset(&local_38,0,0x28);
          local_18 = 0;
          local_118 = local_108;
          local_110 = local_100;
          local_38 = local_2b0;
          local_30 = local_2d8;
          local_28 = local_300;
          local_20 = local_338;
          QtPrivate::argToQString((QAnyStringView *)local_8d8,local_108,local_100);
          local_be9 = runCommand(in_stack_fffffffffffff3c8,
                                 (QString *)CONCAT17(bVar3,in_stack_fffffffffffff3c0));
          QString::~QString((QString *)0x125a6b);
          QString::~QString((QString *)0x125a78);
          QString::~QString((QString *)0x125a85);
          QString::~QString((QString *)0x125a92);
          QString::~QString((QString *)0x125a9f);
          uVar4 = QDir::setCurrent((QString *)local_780);
          if ((uVar4 & 1) == 0) {
            pFVar7 = _stderr;
            QtPrivate::asString(local_780);
            QString::toLocal8Bit((QString *)this_00.m_data);
            pcVar5 = QByteArray::constData((QByteArray *)0x125ae9);
            fprintf(pFVar7,"Cannot set current dir to: %s\n",pcVar5);
            QByteArray::~QByteArray((QByteArray *)0x125b0c);
            local_be9 = false;
          }
          else if ((*(byte *)((long)in_RDI.m_data + 5) & 1) == 0) {
            local_998 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_fffffffffffff3a8,
                                   CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
            local_5d0 = local_998.m_size;
            local_5c8 = local_998.m_data;
            str_09.m_data = this_00.m_data_utf8;
            str_09.m_size = (qsizetype)this.m_data;
            QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_09);
            QAnyStringView::QAnyStringView
                      ((QAnyStringView *)this.m_data,(QString *)in_stack_fffffffffffff3a8);
            s_13.m_size = (size_t)this_00.m_data;
            s_13.field_0.m_data = this.m_data;
            QtPrivate::qStringLikeToArg(s_13);
            local_168 = local_5c0;
            local_160 = local_5b8;
            local_68 = local_5e8;
            local_60 = 0;
            local_178 = local_5c0;
            local_170 = local_5b8;
            QtPrivate::argToQString((QAnyStringView *)local_988,local_5c0,local_5b8);
            QFile::remove((QString *)local_988);
            QString::~QString((QString *)0x125cca);
            QVar6 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffff3a8,
                               CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
            local_9c8 = QVar6.m_size;
            local_618 = local_9c8;
            local_9c0 = QVar6.m_data;
            local_610 = local_9c0;
            str_10.m_data = this_00.m_data_utf8;
            str_10.m_size = (qsizetype)this.m_data;
            QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_10);
            QAnyStringView::QAnyStringView
                      ((QAnyStringView *)this.m_data,(QString *)in_stack_fffffffffffff3a8);
            s_14.m_size = (size_t)this_00.m_data;
            s_14.field_0.m_data = this.m_data;
            QtPrivate::qStringLikeToArg(s_14);
            local_148 = local_608;
            local_140 = local_600;
            local_58 = local_630;
            local_50 = 0;
            local_158 = local_608;
            local_150 = local_600;
            QtPrivate::argToQString((QAnyStringView *)local_9b8,local_608,local_600);
            QDir::QDir(local_9a0,(QString *)local_9b8);
            QDir::removeRecursively();
            QDir::~QDir(local_9a0);
            QString::~QString((QString *)0x125e89);
          }
        }
      }
      else {
        pFVar7 = _stderr;
        local_7e8 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffff3a8,
                               CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
        local_468 = local_7e8.m_size;
        local_460 = local_7e8.m_data;
        str_01.m_data = (char *)in_stack_fffffffffffff3b8;
        str_01.m_size = (qsizetype)in_stack_fffffffffffff3b0.m_data;
        QAnyStringView::QAnyStringView(in_stack_fffffffffffff3a8,str_01);
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)in_stack_fffffffffffff3b0.m_data,
                   (QString *)in_stack_fffffffffffff3a8);
        s_02.m_size = (size_t)in_stack_fffffffffffff3b8;
        s_02.field_0.m_data = in_stack_fffffffffffff3b0.m_data;
        QtPrivate::qStringLikeToArg(s_02);
        local_208 = local_458;
        local_200 = local_450;
        local_b8 = local_480;
        local_b0 = 0;
        local_218 = local_458;
        local_210 = local_450;
        QtPrivate::argToQString((QAnyStringView *)local_7d8,local_458,local_450);
        QtPrivate::asString(local_7d8);
        QString::toLocal8Bit(in_stack_fffffffffffff3b8);
        pcVar5 = QByteArray::constData((QByteArray *)0x124d56);
        fprintf(pFVar7,"Cannot set current dir to: %s\n",pcVar5);
        QByteArray::~QByteArray((QByteArray *)0x124d79);
        QString::~QString((QString *)0x124d86);
        local_be9 = false;
      }
      QString::~QString((QString *)0x125ea8);
    }
    QString::~QString((QString *)0x125eb5);
  }
  else {
    fprintf(_stdout,"Skipping createRCC\n");
    local_be9 = true;
  }
  QString::~QString((QString *)0x125ec2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_be9;
}

Assistant:

bool createRcc(const Options &options)
{
    auto assetsDir = "%1/assets"_L1.arg(options.outputDirectory);
    if (!QDir{"%1/android_rcc_bundle"_L1.arg(assetsDir)}.exists()) {
        fprintf(stdout, "Skipping createRCC\n");
        return true;
    }

    if (options.verbose)
        fprintf(stdout, "Create rcc bundle.\n");


    QString rcc;
    if (!options.rccBinaryPath.isEmpty()) {
        rcc = options.rccBinaryPath;
    } else {
        rcc = execSuffixAppended(options.qtLibExecsDirectory + "/rcc"_L1);
    }

    if (!QFile::exists(rcc)) {
        fprintf(stderr, "rcc not found: %s\n", qPrintable(rcc));
        return false;
    }
    auto currentDir = QDir::currentPath();
    if (!QDir::setCurrent("%1/android_rcc_bundle"_L1.arg(assetsDir))) {
        fprintf(stderr, "Cannot set current dir to: %s\n", qPrintable("%1/android_rcc_bundle"_L1.arg(assetsDir)));
        return false;
    }

    bool res = runCommand(options, "%1 --project -o %2"_L1.arg(rcc, shellQuote("%1/android_rcc_bundle.qrc"_L1.arg(assetsDir))));
    if (!res)
        return false;

    QLatin1StringView noZstd;
    if (!options.isZstdCompressionEnabled)
        noZstd = "--no-zstd"_L1;

    QFile::rename("%1/android_rcc_bundle.qrc"_L1.arg(assetsDir), "%1/android_rcc_bundle/android_rcc_bundle.qrc"_L1.arg(assetsDir));

    res = runCommand(options, "%1 %2 %3 --binary -o %4 android_rcc_bundle.qrc"_L1.arg(rcc, shellQuote("--root=/android_rcc_bundle/"_L1),
                                                                                      noZstd,
                                                                                      shellQuote("%1/android_rcc_bundle.rcc"_L1.arg(assetsDir))));
    if (!QDir::setCurrent(currentDir)) {
        fprintf(stderr, "Cannot set current dir to: %s\n", qPrintable(currentDir));
        return false;
    }
    if (!options.noRccBundleCleanup) {
        QFile::remove("%1/android_rcc_bundle.qrc"_L1.arg(assetsDir));
        QDir{"%1/android_rcc_bundle"_L1.arg(assetsDir)}.removeRecursively();
    }
    return res;
}